

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void __thiscall
QPDF::ForeignStreamData::ForeignStreamData
          (ForeignStreamData *this,shared_ptr<QPDF::EncryptionParameters> *encp,
          shared_ptr<InputSource> *file,QPDFObjGen foreign_og,qpdf_offset_t offset,size_t length,
          QPDFObjectHandle *param_6,bool is_root_metadata)

{
  std::__shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> *)this,
             &encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>,
             &file->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
  this->foreign_og = foreign_og;
  this->offset = offset;
  this->length = length;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&this->local_dict,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)param_6);
  this->is_root_metadata = is_root_metadata;
  return;
}

Assistant:

QPDF::ForeignStreamData::ForeignStreamData(
    std::shared_ptr<EncryptionParameters> encp,
    std::shared_ptr<InputSource> file,
    QPDFObjGen foreign_og,
    qpdf_offset_t offset,
    size_t length,
    QPDFObjectHandle local_dict,
    bool is_root_metadata) :
    encp(encp),
    file(file),
    foreign_og(foreign_og),
    offset(offset),
    length(length),
    local_dict(local_dict),
    is_root_metadata(is_root_metadata)
{
}